

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall
asmjit::v1_14::Zone::_init(Zone *this,size_t blockSize,size_t blockAlignment,Temporary *temporary)

{
  Block *block_00;
  long lVar1;
  long lVar2;
  uint uVar3;
  undefined8 *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  Block *block;
  size_t blockAlignmentShift;
  size_t blockSizeShift;
  char *in_stack_00000360;
  int in_stack_0000036c;
  char *in_stack_00000370;
  Zone *in_stack_ffffffffffffff70;
  ulong local_58;
  ulong local_50;
  undefined1 local_48 [8];
  undefined1 local_40 [32];
  undefined1 *local_20;
  ulong *local_18;
  undefined1 *local_10;
  ulong *local_8;
  
  if (in_RSI < 0x100) {
    DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
  }
  if (0x8000000000000000 < in_RSI) {
    DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
  }
  if (0x40 < in_RDX) {
    DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
  }
  Zone_assignZeroBlock(in_stack_ffffffffffffff70);
  local_10 = local_40;
  local_20 = local_48;
  lVar1 = 0x3f;
  if (in_RSI != 0) {
    for (; in_RSI >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  local_58 = in_RDX | 8;
  local_8 = &local_50;
  local_18 = &local_58;
  lVar2 = 0x3f;
  if (local_58 != 0) {
    for (; local_58 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  uVar3 = 0x40 - ((uint)lVar2 ^ 0x3f);
  *(char *)(in_RDI + 0x18) = (char)uVar3;
  *(byte *)(in_RDI + 0x19) = '@' - ((byte)lVar1 ^ 0x3f);
  *(undefined1 *)(in_RDI + 0x1a) = 0x19;
  *(bool *)(in_RDI + 0x1b) = in_RCX != (undefined8 *)0x0;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(ulong *)(in_RDI + 0x20) = (ulong)(in_RCX != (undefined8 *)0x0);
  if (in_RCX != (undefined8 *)0x0) {
    block_00 = (Block *)*in_RCX;
    block_00->prev = (Block *)0x0;
    block_00->next = (Block *)0x0;
    local_50 = local_58;
    if ((ulong)in_RCX[1] < 0x18) {
      DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
    }
    block_00->size = in_RCX[1] - 0x18;
    Zone_assignBlock((Zone *)(ulong)uVar3,block_00);
    *(undefined8 *)(in_RDI + 0x20) = 1;
  }
  return;
}

Assistant:

void Zone::_init(size_t blockSize, size_t blockAlignment, const Support::Temporary* temporary) noexcept {
  ASMJIT_ASSERT(blockSize >= kMinBlockSize);
  ASMJIT_ASSERT(blockSize <= kMaxBlockSize);
  ASMJIT_ASSERT(blockAlignment <= 64);

  Zone_assignZeroBlock(this);

  size_t blockSizeShift = Support::bitSizeOf<size_t>() - Support::clz(blockSize);
  size_t blockAlignmentShift = Support::bitSizeOf<size_t>() - Support::clz(blockAlignment | (size_t(1) << 3));

  _blockAlignmentShift = uint8_t(blockAlignmentShift);
  _minimumBlockSizeShift = uint8_t(blockSizeShift);
  _maximumBlockSizeShift = uint8_t(25); // (1 << 25) Equals 32 MiB blocks (should be enough for all cases)
  _hasStaticBlock = uint8_t(temporary != nullptr);
  _reserved = uint8_t(0u);
  _blockCount = size_t(temporary != nullptr);

  // Setup the first [temporary] block, if necessary.
  if (temporary) {
    Block* block = temporary->data<Block>();
    block->prev = nullptr;
    block->next = nullptr;

    ASMJIT_ASSERT(temporary->size() >= kBlockSize);
    block->size = temporary->size() - kBlockSize;

    Zone_assignBlock(this, block);
    _blockCount = 1u;
  }
}